

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O2

Orphan<capnp::Text> * __thiscall
capnp::_::anon_unknown_0::PrefixAdder::decode
          (Orphan<capnp::Text> *__return_storage_ptr__,PrefixAdder *this,JsonCodec *codec,
          Reader input,Orphanage orphanage)

{
  Reader RVar1;
  Reader copyFrom;
  Orphanage local_20;
  
  local_20.capTable = orphanage.capTable;
  local_20.arena = orphanage.arena;
  RVar1 = capnp::json::Value::Reader::getString(&input);
  copyFrom.super_StringPtr.content.size_ = RVar1.super_StringPtr.content.size_ - 0xb;
  copyFrom.super_StringPtr.content.ptr = RVar1.super_StringPtr.content.ptr + 0xb;
  Orphanage::newOrphanCopy<capnp::Text::Reader>(__return_storage_ptr__,&local_20,copyFrom);
  return __return_storage_ptr__;
}

Assistant:

Orphan<capnp::Text> decode(const JsonCodec& codec, JsonValue::Reader input,
                             Orphanage orphanage) const override {
    return orphanage.newOrphanCopy(capnp::Text::Reader(input.getString().slice(11)));
  }